

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

Promise<void> __thiscall
capnp::_::TestTailCallerImpl::foo(TestTailCallerImpl *this,FooContext context)

{
  RequestHook **__return_storage_ptr__;
  int32_t value;
  ArrayPtr<const_char> local_e0 [2];
  Maybe<capnp::MessageSize> local_b8;
  Client local_a0;
  undefined1 local_88 [8];
  Request<capnproto_test::capnp::test::TestTailCallee::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  tailRequest;
  Reader params;
  TestTailCallerImpl *this_local;
  FooContext context_local;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  __return_storage_ptr__ = &tailRequest.hook.ptr;
  context_local.hook = (CallContextHook *)this;
  CallContext<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  ::getParams((Reader *)__return_storage_ptr__,
              (CallContext<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
               *)&this_local);
  capnproto_test::capnp::test::TestTailCaller::FooParams::Reader::getCallee
            (&local_a0,(Reader *)__return_storage_ptr__);
  kj::Maybe<capnp::MessageSize>::Maybe(&local_b8);
  capnproto_test::capnp::test::TestTailCallee::Client::fooRequest
            ((Request<capnproto_test::capnp::test::TestTailCallee::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
              *)local_88,&local_a0,&local_b8);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_b8);
  capnproto_test::capnp::test::TestTailCallee::Client::~Client(&local_a0);
  value = capnproto_test::capnp::test::TestTailCaller::FooParams::Reader::getI
                    ((Reader *)&tailRequest.hook.ptr);
  capnproto_test::capnp::test::TestTailCallee::FooParams::Builder::setI((Builder *)local_88,value);
  Text::Reader::Reader((Reader *)local_e0,"from TestTailCaller");
  capnproto_test::capnp::test::TestTailCallee::FooParams::Builder::setT
            ((Builder *)local_88,(Reader)local_e0[0]);
  kj::
  mv<capnp::Request<capnproto_test::capnp::test::TestTailCallee::FooParams,capnproto_test::capnp::test::TestTailCallee::TailResult>>
            ((Request<capnproto_test::capnp::test::TestTailCallee::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
              *)local_88);
  CallContext<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  ::tailCall<capnproto_test::capnp::test::TestTailCallee::FooParams>
            ((CallContext<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
              *)this,(Request<capnproto_test::capnp::test::TestTailCallee::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
                      *)&this_local);
  Request<capnproto_test::capnp::test::TestTailCallee::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  ::~Request((Request<capnproto_test::capnp::test::TestTailCallee::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
              *)local_88);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestTailCallerImpl::foo(FooContext context) {
  ++callCount;

  auto params = context.getParams();
  auto tailRequest = params.getCallee().fooRequest();
  tailRequest.setI(params.getI());
  tailRequest.setT("from TestTailCaller");
  return context.tailCall(kj::mv(tailRequest));
}